

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_resist(parser *p)

{
  long *plVar1;
  char *name_00;
  wchar_t local_30;
  wchar_t idx;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar1 = (long *)parser_priv(p);
  name_00 = parser_getsym(p,"elem");
  if (name_00 == (char *)0x0) {
    local_30 = L'\xffffffff';
  }
  else {
    local_30 = proj_name_to_idx(name_00);
  }
  if (plVar1 != (long *)0x0) {
    if (*plVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else if ((local_30 < L'\0') || (L'\x1b' < local_30)) {
      p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    }
    else {
      *(wchar_t *)(*plVar1 + 0x68) = local_30;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x15e,"enum parser_error parse_player_timed_resist(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_resist(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "elem");
	int idx = (name) ? proj_name_to_idx(name) : -1;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (idx < 0 || idx >= ELEM_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	ps->t->temp_resist = idx;
	return PARSE_ERROR_NONE;
}